

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_key(nk_text_edit *state,nk_keys key,int shift_mod,nk_user_font *font,
                    float row_height)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  nk_text_find *pnVar4;
  char *pcVar5;
  int iVar6;
  nk_text_find *pnVar7;
  float fVar8;
  int len;
  nk_text_find find;
  nk_text_edit_row row;
  nk_rune local_88;
  float local_84;
  int local_80;
  float local_7c;
  float local_78;
  nk_rune local_74;
  nk_text_find *local_70;
  nk_str *local_68;
  nk_text_find local_60;
  nk_text_edit_row local_48;
  
  pnVar7 = (nk_text_find *)&state->preferred_x;
  local_68 = &state->string;
LAB_00146ded:
  switch(key) {
  case NK_KEY_DEL:
    if (state->mode == '\0') {
      return;
    }
    if (state->select_start == state->select_end) {
      if (state->cursor < (state->string).len) {
        nk_textedit_delete(state,state->cursor,1);
      }
      goto LAB_00147812;
    }
    goto LAB_001474d4;
  default:
    goto switchD_00146e00_caseD_4;
  case NK_KEY_BACKSPACE:
    if (state->mode == '\0') {
      return;
    }
    if (state->select_start == state->select_end) {
      nk_textedit_clamp(state);
      if (0 < state->cursor) {
        nk_textedit_delete(state,state->cursor + -1,1);
        state->cursor = state->cursor + -1;
      }
      goto LAB_00147812;
    }
LAB_001474d4:
    nk_textedit_delete_selection(state);
    goto LAB_00147812;
  case NK_KEY_UP:
    uVar1 = state->single_line;
    key = NK_KEY_LEFT;
    if (uVar1 == '\0') {
      if (shift_mod == 0) {
        iVar3 = state->select_start;
        iVar6 = state->select_end;
        if (iVar3 != iVar6) {
          if (iVar6 < iVar3) {
            state->select_end = iVar3;
            state->select_start = iVar6;
          }
          state->cursor = state->select_start;
          state->select_end = state->select_start;
          state->has_preferred_x = '\0';
        }
      }
      else if (state->select_start == state->select_end) {
        state->select_end = state->cursor;
        state->select_start = state->cursor;
      }
      else {
        state->cursor = state->select_end;
      }
      nk_textedit_clamp(state);
      nk_textedit_find_charpos
                (&local_60,state,state->cursor,(uint)state->single_line,font,row_height);
      iVar3 = local_60.prev_first;
      key = NK_KEY_UP;
      if (local_60.prev_first != local_60.first_char) {
        pnVar4 = pnVar7;
        if (state->has_preferred_x == '\0') {
          pnVar4 = &local_60;
        }
        local_84 = pnVar4->x;
        state->cursor = local_60.prev_first;
        local_80 = shift_mod;
        local_70 = pnVar7;
        nk_textedit_layout_row(&local_48,state,local_60.prev_first,row_height,font);
        iVar6 = local_48.num_chars;
        if ((0 < local_48.num_chars) && (local_7c = local_48.x1, local_48.x0 < local_48.x1)) {
          iVar2 = 1;
          fVar8 = local_48.x0;
          do {
            local_88 = 0;
            local_74 = 0;
            local_78 = fVar8;
            pcVar5 = nk_str_at_const(local_68,iVar2 + iVar3 + -1,&local_74,(int *)&local_88);
            fVar8 = (*font->width)(font->userdata,font->height,pcVar5,local_88);
            fVar8 = fVar8 + local_78;
            if ((local_84 < fVar8) || (state->cursor = state->cursor + 1, iVar6 <= iVar2)) break;
            iVar2 = iVar2 + 1;
          } while (fVar8 < local_7c);
        }
        nk_textedit_clamp(state);
        state->has_preferred_x = '\x01';
        state->preferred_x = local_84;
        pnVar7 = local_70;
        shift_mod = local_80;
        if (local_80 != 0) {
          state->select_end = state->cursor;
        }
      }
    }
    goto joined_r0x001471cd;
  case NK_KEY_DOWN:
    uVar1 = state->single_line;
    key = NK_KEY_RIGHT;
    if (uVar1 == '\0') {
      if (shift_mod == 0) {
        if (state->select_start != state->select_end) {
          nk_textedit_move_to_last(state);
        }
      }
      else if (state->select_start == state->select_end) {
        state->select_end = state->cursor;
        state->select_start = state->cursor;
      }
      else {
        state->cursor = state->select_end;
      }
      nk_textedit_clamp(state);
      nk_textedit_find_charpos
                (&local_60,state,state->cursor,(uint)state->single_line,font,row_height);
      key = NK_KEY_DOWN;
      if (local_60.length != 0) {
        pnVar4 = pnVar7;
        if (state->has_preferred_x == '\0') {
          pnVar4 = &local_60;
        }
        local_84 = pnVar4->x;
        iVar6 = local_60.length + local_60.first_char;
        state->cursor = iVar6;
        local_80 = shift_mod;
        local_70 = pnVar7;
        nk_textedit_layout_row(&local_48,state,iVar6,row_height,font);
        iVar3 = local_48.num_chars;
        if ((0 < local_48.num_chars) && (local_7c = local_48.x1, local_48.x0 < local_48.x1)) {
          iVar2 = 1;
          fVar8 = local_48.x0;
          do {
            local_88 = 0;
            local_74 = 0;
            local_78 = fVar8;
            pcVar5 = nk_str_at_const(local_68,iVar2 + iVar6 + -1,&local_74,(int *)&local_88);
            fVar8 = (*font->width)(font->userdata,font->height,pcVar5,local_88);
            fVar8 = fVar8 + local_78;
            if ((local_84 < fVar8) || (state->cursor = state->cursor + 1, iVar3 <= iVar2)) break;
            iVar2 = iVar2 + 1;
          } while (fVar8 < local_7c);
        }
        nk_textedit_clamp(state);
        state->has_preferred_x = '\x01';
        state->preferred_x = local_84;
        pnVar7 = local_70;
        shift_mod = local_80;
        if (local_80 != 0) {
          state->select_end = state->cursor;
        }
      }
    }
joined_r0x001471cd:
    if (uVar1 == '\0') {
      return;
    }
    goto LAB_00146ded;
  case NK_KEY_LEFT:
    if (shift_mod != 0) {
      nk_textedit_clamp(state);
      if (state->select_start == state->select_end) {
        state->select_end = state->cursor;
        state->select_start = state->cursor;
      }
      else {
        state->cursor = state->select_end;
      }
      if (0 < state->select_end) {
        state->select_end = state->select_end + -1;
      }
      goto LAB_001477a8;
    }
    iVar3 = state->select_start;
    iVar6 = state->select_end;
    if (iVar3 != iVar6) {
      if (iVar6 < iVar3) {
        state->select_end = iVar3;
        state->select_start = iVar6;
      }
      state->cursor = state->select_start;
      state->select_end = state->select_start;
      state->has_preferred_x = '\0';
      goto LAB_00147812;
    }
    if (state->cursor < 1) goto LAB_00147812;
    local_60.first_char = state->cursor + -1;
    goto LAB_0014780c;
  case NK_KEY_RIGHT:
    iVar3 = state->select_end;
    if (shift_mod == 0) {
      if (state->select_start == iVar3) {
        state->cursor = state->cursor + 1;
      }
      else {
        nk_textedit_move_to_last(state);
      }
      nk_textedit_clamp(state);
      goto LAB_00147812;
    }
    if (state->select_start == iVar3) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    else {
      state->cursor = iVar3;
    }
    state->select_end = state->select_end + 1;
    nk_textedit_clamp(state);
LAB_001477a8:
    local_60.first_char = state->select_end;
    goto LAB_0014780c;
  case NK_KEY_TEXT_INSERT_MODE:
    if (state->mode == '\0') {
      state->mode = '\x01';
      return;
    }
    return;
  case NK_KEY_TEXT_REPLACE_MODE:
    if (state->mode == '\0') {
      state->mode = '\x02';
      return;
    }
    return;
  case NK_KEY_TEXT_RESET_MODE:
    if ((byte)(state->mode - 1) < 2) {
      state->mode = '\0';
      return;
    }
    return;
  case NK_KEY_TEXT_LINE_START:
    if (shift_mod == 0) {
      iVar3 = (state->string).len;
      if ((iVar3 != 0) && (state->cursor == iVar3)) {
        state->cursor = state->cursor + -1;
      }
      nk_textedit_clamp(state);
      iVar3 = state->select_start;
      iVar6 = state->select_end;
      if (iVar3 != iVar6) {
        if (iVar6 < iVar3) {
          state->select_end = iVar3;
          state->select_start = iVar6;
        }
        state->cursor = state->select_start;
        state->select_end = state->select_start;
        state->has_preferred_x = '\0';
      }
      nk_textedit_find_charpos
                (&local_60,state,state->cursor,(uint)state->single_line,font,row_height);
      goto LAB_0014780c;
    }
    nk_textedit_clamp(state);
    if (state->select_start == state->select_end) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    else {
      state->cursor = state->select_end;
    }
    iVar3 = (state->string).len;
    if ((iVar3 != 0) && (state->cursor == iVar3)) {
      state->cursor = state->cursor + -1;
    }
    nk_textedit_find_charpos(&local_60,state,state->cursor,(uint)state->single_line,font,row_height)
    ;
    break;
  case NK_KEY_TEXT_LINE_END:
    if (shift_mod != 0) {
      nk_textedit_clamp(state);
      if (state->select_start == state->select_end) {
        state->select_end = state->cursor;
        state->select_start = state->cursor;
      }
      else {
        state->cursor = state->select_end;
      }
      nk_textedit_find_charpos
                (&local_60,state,state->cursor,(uint)state->single_line,font,row_height);
      state->has_preferred_x = '\0';
      state->cursor = local_60.first_char + local_60.length;
      if (0 < local_60.length) {
        local_88 = 0;
        nk_str_at_const(local_68,local_60.first_char + local_60.length + -1,&local_88,
                        (int *)&local_48);
        if (local_88 == 10) {
          state->cursor = state->cursor + -1;
        }
      }
      state->select_end = state->cursor;
      return;
    }
    nk_textedit_clamp(state);
    iVar3 = state->select_start;
    iVar6 = state->select_end;
    if (iVar3 != iVar6) {
      if (iVar6 < iVar3) {
        state->select_end = iVar3;
        state->select_start = iVar6;
      }
      state->cursor = state->select_start;
      state->select_end = state->select_start;
      state->has_preferred_x = '\0';
    }
    nk_textedit_find_charpos(&local_60,state,state->cursor,(uint)state->single_line,font,row_height)
    ;
    state->has_preferred_x = '\0';
    state->cursor = local_60.first_char + local_60.length;
    if (0 < local_60.length) {
      local_88 = 0;
      nk_str_at_const(local_68,local_60.first_char + local_60.length + -1,&local_88,(int *)&local_48
                     );
      if (local_88 == 10) {
        state->cursor = state->cursor + -1;
        return;
      }
      return;
    }
    return;
  case NK_KEY_TEXT_START:
    if (shift_mod == 0) {
      state->select_end = 0;
      state->cursor = 0;
      state->select_start = 0;
      goto LAB_00147812;
    }
    if (state->select_start == state->select_end) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    else {
      state->cursor = state->select_end;
    }
    local_60.first_char = 0;
    break;
  case NK_KEY_TEXT_END:
    if (shift_mod == 0) {
      state->cursor = (state->string).len;
      state->select_start = 0;
      state->select_end = 0;
      goto LAB_00147812;
    }
    if (state->select_start == state->select_end) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    else {
      state->cursor = state->select_end;
    }
    local_60.first_char = (state->string).len;
    break;
  case NK_KEY_TEXT_UNDO:
    nk_textedit_undo(state);
    goto LAB_00147812;
  case NK_KEY_TEXT_REDO:
    nk_textedit_redo(state);
    goto LAB_00147812;
  case NK_KEY_TEXT_SELECT_ALL:
    if (state == (nk_text_edit *)0x0) {
      __assert_fail("state",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x57cd,"void nk_textedit_select_all(struct nk_text_edit *)");
    }
    state->select_start = 0;
    iVar3 = (state->string).len;
    goto LAB_00147399;
  case NK_KEY_TEXT_WORD_LEFT:
    iVar3 = state->select_start;
    iVar6 = state->select_end;
    if (shift_mod == 0) {
      if (iVar3 != iVar6) {
        if (iVar6 < iVar3) {
          state->select_end = iVar3;
          state->select_start = iVar6;
        }
        iVar3 = state->select_start;
        state->cursor = iVar3;
LAB_00147399:
        state->select_end = iVar3;
        goto LAB_00147812;
      }
      iVar3 = state->cursor;
      goto LAB_001475a7;
    }
    if (iVar3 == iVar6) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    iVar3 = state->cursor;
    goto LAB_00147291;
  case NK_KEY_TEXT_WORD_RIGHT:
    if (shift_mod == 0) {
      if (state->select_start != state->select_end) {
        nk_textedit_move_to_last(state);
        return;
      }
      iVar3 = nk_textedit_move_to_word_next(state);
      goto LAB_00147600;
    }
    if (state->select_start == state->select_end) {
      state->select_end = state->cursor;
      state->select_start = state->cursor;
    }
    iVar3 = nk_textedit_move_to_word_next(state);
    goto LAB_001473d7;
  }
  state->select_end = local_60.first_char;
LAB_0014780c:
  state->cursor = local_60.first_char;
LAB_00147812:
  state->has_preferred_x = '\0';
  return;
  while (iVar2 = nk_is_word_boundary(state,iVar6), iVar3 = iVar6, iVar2 == 0) {
LAB_001475a7:
    iVar6 = iVar3 + -1;
    if (iVar3 < 1) break;
  }
  iVar3 = 0;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
LAB_00147600:
  state->cursor = iVar3;
  goto LAB_00147606;
  while (iVar2 = nk_is_word_boundary(state,iVar6), iVar3 = iVar6, iVar2 == 0) {
LAB_00147291:
    iVar6 = iVar3 + -1;
    if (iVar3 < 1) break;
  }
  iVar3 = 0;
  if (0 < iVar6) {
    iVar3 = iVar6;
  }
LAB_001473d7:
  state->cursor = iVar3;
  state->select_end = iVar3;
LAB_00147606:
  nk_textedit_clamp(state);
switchD_00146e00_caseD_4:
  return;
}

Assistant:

NK_LIB void
nk_textedit_key(struct nk_text_edit *state, enum nk_keys key, int shift_mod,
    const struct nk_user_font *font, float row_height)
{
retry:
    switch (key)
    {
    case NK_KEY_NONE:
    case NK_KEY_CTRL:
    case NK_KEY_ENTER:
    case NK_KEY_SHIFT:
    case NK_KEY_TAB:
    case NK_KEY_COPY:
    case NK_KEY_CUT:
    case NK_KEY_PASTE:
    case NK_KEY_MAX:
    default: break;
    case NK_KEY_TEXT_UNDO:
         nk_textedit_undo(state);
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_REDO:
        nk_textedit_redo(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_SELECT_ALL:
        nk_textedit_select_all(state);
        state->has_preferred_x = 0;
        break;

    case NK_KEY_TEXT_INSERT_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_INSERT;
        break;
    case NK_KEY_TEXT_REPLACE_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            state->mode = NK_TEXT_EDIT_MODE_REPLACE;
        break;
    case NK_KEY_TEXT_RESET_MODE:
        if (state->mode == NK_TEXT_EDIT_MODE_INSERT ||
            state->mode == NK_TEXT_EDIT_MODE_REPLACE)
            state->mode = NK_TEXT_EDIT_MODE_VIEW;
        break;

    case NK_KEY_LEFT:
        if (shift_mod) {
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection left */
            if (state->select_end > 0)
                --state->select_end;
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to start of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else if (state->cursor > 0)
               --state->cursor;
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_RIGHT:
        if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            /* move selection right */
            ++state->select_end;
            nk_textedit_clamp(state);
            state->cursor = state->select_end;
            state->has_preferred_x = 0;
        } else {
            /* if currently there's a selection,
             * move cursor to end of selection */
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else ++state->cursor;
            nk_textedit_clamp(state);
            state->has_preferred_x = 0;
        } break;

    case NK_KEY_TEXT_WORD_LEFT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_previous(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state );
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_first(state);
            else {
                state->cursor = nk_textedit_move_to_word_previous(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_TEXT_WORD_RIGHT:
        if (shift_mod) {
            if( !NK_TEXT_HAS_SELECTION( state ) )
                nk_textedit_prep_selection_at_cursor(state);
            state->cursor = nk_textedit_move_to_word_next(state);
            state->select_end = state->cursor;
            nk_textedit_clamp(state);
        } else {
            if (NK_TEXT_HAS_SELECTION(state))
                nk_textedit_move_to_last(state);
            else {
                state->cursor = nk_textedit_move_to_word_next(state);
                nk_textedit_clamp(state );
            }
        } break;

    case NK_KEY_DOWN: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down in single-line behave like left&right */
            key = NK_KEY_RIGHT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_last(state);

        /* compute current position of cursor point */
        nk_textedit_clamp(state);
        nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
            font, row_height);

        /* now find character position down a row */
        if (find.length)
        {
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;
            int start = find.first_char + find.length;

            state->cursor = start;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, start, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel)
                state->select_end = state->cursor;
        }
    } break;

    case NK_KEY_UP: {
        struct nk_text_find find;
        struct nk_text_edit_row row;
        int i, sel = shift_mod;

        if (state->single_line) {
            /* on windows, up&down become left&right */
            key = NK_KEY_LEFT;
            goto retry;
        }

        if (sel)
            nk_textedit_prep_selection_at_cursor(state);
        else if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_move_to_first(state);

         /* compute current position of cursor point */
         nk_textedit_clamp(state);
         nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

         /* can only go up if there's a previous row */
         if (find.prev_first != find.first_char) {
            /* now find character position up a row */
            float x;
            float goal_x = state->has_preferred_x ? state->preferred_x : find.x;

            state->cursor = find.prev_first;
            nk_textedit_layout_row(&row, state, state->cursor, row_height, font);
            x = row.x0;

            for (i=0; i < row.num_chars && x < row.x1; ++i) {
                float dx = nk_textedit_get_width(state, find.prev_first, i, font);
                x += dx;
                if (x > goal_x)
                    break;
                ++state->cursor;
            }
            nk_textedit_clamp(state);

            state->has_preferred_x = 1;
            state->preferred_x = goal_x;
            if (sel) state->select_end = state->cursor;
         }
      } break;

    case NK_KEY_DEL:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            int n = state->string.len;
            if (state->cursor < n)
                nk_textedit_delete(state, state->cursor, 1);
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_BACKSPACE:
        if (state->mode == NK_TEXT_EDIT_MODE_VIEW)
            break;
        if (NK_TEXT_HAS_SELECTION(state))
            nk_textedit_delete_selection(state);
        else {
            nk_textedit_clamp(state);
            if (state->cursor > 0) {
                nk_textedit_delete(state, state->cursor-1, 1);
                --state->cursor;
            }
         }
         state->has_preferred_x = 0;
         break;

    case NK_KEY_TEXT_START:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = 0;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_END:
         if (shift_mod) {
            nk_textedit_prep_selection_at_cursor(state);
            state->cursor = state->select_end = state->string.len;
            state->has_preferred_x = 0;
         } else {
            state->cursor = state->string.len;
            state->select_start = state->select_end = 0;
            state->has_preferred_x = 0;
         }
         break;

    case NK_KEY_TEXT_LINE_START: {
        if (shift_mod) {
            struct nk_text_find find;
           nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_find_charpos(&find, state,state->cursor, state->single_line,
                font, row_height);
            state->cursor = state->select_end = find.first_char;
            state->has_preferred_x = 0;
        } else {
            struct nk_text_find find;
            if (state->string.len && state->cursor == state->string.len)
                --state->cursor;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->cursor = find.first_char;
            state->has_preferred_x = 0;
        }
      } break;

    case NK_KEY_TEXT_LINE_END: {
        if (shift_mod) {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_prep_selection_at_cursor(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);
            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
            state->select_end = state->cursor;
        } else {
            struct nk_text_find find;
            nk_textedit_clamp(state);
            nk_textedit_move_to_first(state);
            nk_textedit_find_charpos(&find, state, state->cursor, state->single_line,
                font, row_height);

            state->has_preferred_x = 0;
            state->cursor = find.first_char + find.length;
            if (find.length > 0 && nk_str_rune_at(&state->string, state->cursor-1) == '\n')
                --state->cursor;
        }} break;
    }
}